

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sethostname.c
# Opt level: O0

int gethostname(char *__name,size_t __len)

{
  char *__src;
  char *force_hostname;
  size_t namelen_local;
  char *name_local;
  
  __src = getenv("CURL_GETHOSTNAME");
  if (__src == (char *)0x0) {
    name_local._4_4_ = -1;
  }
  else {
    strncpy(__name,__src,__len);
    __name[__len - 1] = '\0';
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

int gethostname(char *name, GETHOSTNAME_TYPE_ARG2 namelen)
{
  const char *force_hostname = getenv("CURL_GETHOSTNAME");
  if(force_hostname) {
    strncpy(name, force_hostname, namelen);
    name[namelen-1] = '\0';
    return 0;
  }

  /* LD_PRELOAD used, but no hostname set, we'll just return a failure */
  return -1;
}